

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR lyxp_expr_parse(ly_ctx *ctx,char *expr_str,size_t expr_len,ly_bool reparse,lyxp_expr **expr_p
                      )

{
  long lVar1;
  lyxp_expr_type *plVar2;
  bool bVar3;
  byte bVar4;
  LY_ERR LVar5;
  int iVar6;
  uint uVar7;
  LY_ERR LVar8;
  lyxp_expr *exp;
  lyxp_token *plVar9;
  uint32_t *puVar10;
  ushort **ppuVar11;
  ssize_t sVar12;
  ssize_t sVar13;
  lyxp_expr_type **pplVar14;
  char *pcVar15;
  undefined7 in_register_00000009;
  char *pcVar16;
  lyxp_token token;
  ulong uVar17;
  char cVar18;
  char *pcVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  lyxp_expr **pplVar23;
  bool bVar24;
  size_t sStackY_a0;
  undefined8 in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  uint32_t tok_idx;
  char *buf;
  undefined4 local_4c;
  lyxp_expr **local_48;
  size_t local_40;
  size_t size;
  
  tok_idx = 0;
  if (expr_p == (lyxp_expr **)0x0) {
    __assert_fail("expr_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0xb52,
                  "LY_ERR lyxp_expr_parse(const struct ly_ctx *, const char *, size_t, ly_bool, struct lyxp_expr **)"
                 );
  }
  if (*expr_str == '\0') {
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unexpected XPath expression end.");
    return LY_EVALID;
  }
  if (expr_len == 0) {
    expr_len = strlen(expr_str);
  }
  if (expr_len >> 0x20 != 0) {
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"XPath expression cannot be longer than %u characters.",
            0xffffffffffffffff);
    return LY_EVALID;
  }
  exp = (lyxp_expr *)calloc(1,0x30);
  if (exp != (lyxp_expr *)0x0) {
    local_4c = (undefined4)CONCAT71(in_register_00000009,reparse);
    LVar5 = lydict_insert(ctx,expr_str,expr_len,&exp->expr);
    if (LVar5 != LY_SUCCESS) goto LAB_0019a277;
    exp->used = 0;
    exp->size = 10;
    plVar9 = (lyxp_token *)malloc(0x28);
    exp->tokens = plVar9;
    if (plVar9 != (lyxp_token *)0x0) {
      puVar10 = (uint32_t *)malloc(0x28);
      exp->tok_pos = puVar10;
      if (puVar10 != (uint32_t *)0x0) {
        puVar10 = (uint32_t *)malloc(0x28);
        exp->tok_len = puVar10;
        if (puVar10 != (uint32_t *)0x0) {
          pcVar15 = exp->expr;
          lVar21 = 0;
          while ((uVar22 = (ulong)(byte)pcVar15[lVar21], uVar22 < 0x21 &&
                 ((0x100002600U >> (uVar22 & 0x3f) & 1) != 0))) {
            lVar21 = lVar21 + 1;
          }
          bVar3 = false;
          bVar24 = false;
          local_48 = expr_p;
          do {
            pcVar16 = pcVar15 + lVar21;
            cVar18 = (char)uVar22;
            iVar6 = (int)uVar22;
            switch(iVar6) {
            case 0x22:
              sStackY_a0 = 2;
              do {
                if (pcVar16[sStackY_a0 + -1] == '\0') {
                  sStackY_a0 = 0x22;
LAB_0019ab36:
                  ly_vlog(ctx,(char *)0x0,LYVE_XPATH,
                          "Unterminated string delimited with %c (%.15s).",sStackY_a0);
                  goto LAB_0019ab49;
                }
                if (pcVar16[sStackY_a0 + -1] == '\"') goto LAB_0019a43f;
                sStackY_a0 = sStackY_a0 + 1;
              } while( true );
            case 0x23:
            case 0x24:
            case 0x25:
            case 0x26:
            case 0x2a:
            case 0x2b:
            case 0x2d:
switchD_0019a2c7_caseD_23:
              ppuVar11 = __ctype_b_loc();
              if ((*(byte *)((long)*ppuVar11 + (long)cVar18 * 2 + 1) & 8) != 0) {
LAB_0019a49a:
                sStackY_a0 = -1;
                do {
                  lVar1 = sStackY_a0 + 1;
                  sStackY_a0 = sStackY_a0 + 1;
                } while ((*(byte *)((long)*ppuVar11 + (long)pcVar16[lVar1] * 2 + 1) & 8) != 0);
                if (pcVar16[lVar1] == '.') {
                  do {
                    lVar1 = sStackY_a0 + 1;
                    sStackY_a0 = sStackY_a0 + 1;
                  } while ((*(byte *)((long)*ppuVar11 + (long)pcVar16[lVar1] * 2 + 1) & 8) != 0);
                }
                token = LYXP_TOKEN_NUMBER;
                break;
              }
              if (cVar18 == '!') {
                if (pcVar16[1] == '=') {
                  sStackY_a0 = 2;
                  token = LYXP_TOKEN_OPER_NEQUAL;
                  break;
                }
LAB_0019a5c5:
                if (exp->used == 0) {
LAB_0019a5eb:
                  sVar12 = 1;
                  if ((cVar18 != '*') &&
                     (sVar12 = parse_ncname(in_stack_ffffffffffffff70), sVar12 < 1))
                  goto LAB_0019ab5d;
                  lVar1 = lVar21 + sVar12;
                  bVar4 = 1;
                  if ((pcVar15[lVar1] != ':') || (bVar4 = 1, pcVar15[lVar1 + 1] != ':')) {
LAB_0019a859:
                    pcVar16 = pcVar15 + lVar21;
                    if (pcVar16[sVar12] != ':') {
                      bVar24 = *pcVar16 != '*';
                      bVar3 = (bool)(bVar4 & bVar24);
                      token = LYXP_TOKEN_NAMETEST;
                      sStackY_a0 = sVar12;
                      break;
                    }
                    if (pcVar16[sVar12 + 1] == '*') {
                      sStackY_a0 = sVar12 + 2;
                    }
                    else {
                      sVar13 = parse_ncname(in_stack_ffffffffffffff70);
                      if (sVar13 < 1) {
                        lVar21 = lVar21 - sVar13;
                        goto switchD_0019a650_caseD_7;
                      }
                      sStackY_a0 = sVar12 + 1 + sVar13;
                    }
                    token = LYXP_TOKEN_NAMETEST;
                    goto LAB_0019a590;
                  }
                  switch(sVar12) {
                  case 4:
                    pcVar19 = "self";
                    sStackY_a0 = 4;
                    break;
                  case 5:
                    pcVar19 = "child";
                    sStackY_a0 = 5;
                    break;
                  case 6:
                    pcVar19 = "parent";
                    sStackY_a0 = 6;
                    break;
                  default:
                    goto switchD_0019a650_caseD_7;
                  case 8:
                    pcVar19 = "ancestor";
                    sStackY_a0 = 8;
                    break;
                  case 9:
                    iVar6 = strncmp("attribute",pcVar16,9);
                    if ((iVar6 != 0) && (iVar6 = strncmp("following",pcVar16,9), iVar6 != 0)) {
                      iVar6 = strncmp("namespace",pcVar16,9);
                      if (iVar6 == 0) {
                        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Axis \"namespace\" not supported.")
                        ;
                        goto switchD_0019a650_caseD_7;
                      }
                      iVar6 = strncmp("preceding",pcVar16,9);
                      goto joined_r0x0019a79d;
                    }
                    goto LAB_0019a7d3;
                  case 10:
                    pcVar19 = "descendant";
                    sStackY_a0 = 10;
                    break;
                  case 0x10:
                    pcVar19 = "ancestor-or-self";
                    sStackY_a0 = 0x10;
                    break;
                  case 0x11:
                    iVar6 = strncmp("following-sibling",pcVar16,0x11);
                    if (iVar6 == 0) goto LAB_0019a7d3;
                    pcVar19 = "preceding-sibling";
                    sStackY_a0 = 0x11;
                    break;
                  case 0x12:
                    pcVar19 = "descendant-or-self";
                    sStackY_a0 = 0x12;
                  }
                  iVar6 = strncmp(pcVar19,pcVar16,sStackY_a0);
joined_r0x0019a79d:
                  if (iVar6 == 0) {
LAB_0019a7d3:
                    LVar5 = exp_add_token(ctx,exp,LYXP_TOKEN_AXISNAME,(uint32_t)lVar21,
                                          (uint32_t)sVar12);
                    if ((LVar5 == LY_SUCCESS) &&
                       (LVar5 = exp_add_token(ctx,exp,LYXP_TOKEN_DCOLON,(uint32_t)lVar1,2),
                       LVar5 == LY_SUCCESS)) {
                      lVar21 = lVar1 + 2;
                      if (pcVar15[lVar1 + 2] == '*') {
                        sVar12 = 1;
                      }
                      else {
                        sVar12 = parse_ncname(in_stack_ffffffffffffff70);
                        if (sVar12 < 1) {
                          lVar21 = lVar21 - sVar12;
                          uVar22 = (ulong)(uint)(int)pcVar15[lVar21];
                          goto LAB_0019ac29;
                        }
                      }
                      bVar4 = 0;
                      goto LAB_0019a859;
                    }
                    goto LAB_0019a277;
                  }
switchD_0019a650_caseD_7:
                  uVar22 = (ulong)(uint)(int)pcVar15[lVar21];
                  uVar20 = (int)lVar21 + 1;
                  pcVar16 = "Invalid character \'%c\'[%u] of expression \'%s\'.";
                }
                else {
                  uVar7 = exp->used - 1;
                  if ((exp->tokens[uVar7] < LYXP_TOKEN_AXISNAME) &&
                     ((0x3fc18aU >> (exp->tokens[uVar7] & (LYXP_TOKEN_NUMBER|LYXP_TOKEN_AT)) & 1) !=
                      0)) goto LAB_0019a5eb;
                  if (cVar18 == 'o') {
                    if (pcVar16[1] == 'r') {
                      sStackY_a0 = 2;
LAB_0019a930:
                      token = LYXP_TOKEN_OPER_LOG;
                      break;
                    }
                  }
                  else if (iVar6 == 0x61) {
                    if ((pcVar16[1] == 'n') && (pcVar16[2] == 'd')) {
                      sStackY_a0 = 3;
                      goto LAB_0019a930;
                    }
                  }
                  else if (iVar6 == 100) {
                    if ((pcVar16[1] == 'i') && (pcVar16[2] == 'v')) {
LAB_0019a917:
                      sStackY_a0 = 3;
LAB_0019a919:
                      token = LYXP_TOKEN_OPER_MATH;
                      break;
                    }
                  }
                  else if (iVar6 == 0x6d) {
                    if ((pcVar16[1] == 'o') && (pcVar16[2] == 'd')) goto LAB_0019a917;
                  }
                  else if (iVar6 == 0x2a) {
                    sStackY_a0 = 1;
                    goto LAB_0019a919;
                  }
                  uVar20 = (uint)cVar18;
                  uVar22 = (ulong)uVar20;
                  if (!bVar24 && !bVar3) {
LAB_0019ac29:
                    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,
                            "Invalid character \'%c\'[%u] of expression \'%s\'.",uVar22,
                            (ulong)((int)lVar21 + 1),pcVar15);
                    LVar5 = LY_EVALID;
                    goto LAB_0019a277;
                  }
                  pcVar15 = (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                                             exp->tok_len[uVar7]);
                  pcVar16 = 
                  "Invalid character 0x%x (\'%c\'), perhaps \"%.*s\" is supposed to be a function call."
                  ;
                }
                ly_vlog(ctx,(char *)0x0,LYVE_XPATH,pcVar16,uVar22,(ulong)uVar20,pcVar15);
              }
              else {
                if (iVar6 != 0x24) {
                  if ((iVar6 == 0x2b) || (iVar6 == 0x2d)) {
                    sStackY_a0 = 1;
                    token = LYXP_TOKEN_OPER_MATH;
                  }
                  else if (iVar6 == 0x2f) {
                    token = pcVar16[1] == '/' | LYXP_TOKEN_OPER_PATH;
                    sStackY_a0 = (ulong)(pcVar16[1] == '/') + 1;
                  }
                  else if (iVar6 == 0x3c) {
LAB_0019a4d2:
                    if (pcVar16[1] == '=') {
                      sStackY_a0 = 2;
                    }
                    else {
                      sStackY_a0 = 1;
                    }
                    token = LYXP_TOKEN_OPER_COMP;
                  }
                  else if (iVar6 == 0x3d) {
                    sStackY_a0 = 1;
                    token = LYXP_TOKEN_OPER_EQUAL;
                  }
                  else {
                    if (iVar6 == 0x3e) goto LAB_0019a4d2;
                    if (iVar6 != 0x7c) goto LAB_0019a5c5;
                    token = LYXP_TOKEN_OPER_UNI;
                    sStackY_a0 = 1;
                  }
                  break;
                }
                lVar1 = lVar21 + 1;
                lVar21 = lVar21 + 1;
                sVar12 = parse_ncname(in_stack_ffffffffffffff70);
                if (sVar12 < 1) {
LAB_0019ab5d:
                  lVar21 = lVar21 - sVar12;
                  goto switchD_0019a650_caseD_7;
                }
                token = LYXP_TOKEN_VARREF;
                sStackY_a0 = sVar12;
                if (pcVar15[sVar12 + lVar1] != ':') break;
                ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Variable with prefix is not supported.");
              }
LAB_0019ab49:
              LVar5 = LY_EVALID;
              goto LAB_0019a277;
            case 0x27:
              sStackY_a0 = 2;
              while( true ) {
                if (pcVar16[sStackY_a0 + -1] == '\0') {
                  sStackY_a0 = 0x27;
                  goto LAB_0019ab36;
                }
                if (pcVar16[sStackY_a0 + -1] == '\'') break;
                sStackY_a0 = sStackY_a0 + 1;
              }
LAB_0019a43f:
              token = LYXP_TOKEN_LITERAL;
              break;
            case 0x28:
              if ((!bVar24) || (exp->used == 0)) {
LAB_0019a500:
                if (bVar3) {
                  if (exp->used != 0) {
                    uVar7 = exp->used - 1;
                    if (exp->tokens[uVar7] == LYXP_TOKEN_NAMETEST) {
                      exp->tokens[uVar7] = LYXP_TOKEN_FUNCNAME;
                      goto LAB_0019a582;
                    }
                  }
                }
                else {
                  bVar3 = false;
                }
                sStackY_a0 = 1;
                token = LYXP_TOKEN_PAR1;
                break;
              }
              plVar9 = exp->tokens;
              uVar7 = exp->used - 1;
              if (plVar9[uVar7] != LYXP_TOKEN_NAMETEST) goto LAB_0019a500;
              if (exp->tok_len[uVar7] == 7) {
                pcVar16 = pcVar15 + exp->tok_pos[uVar7];
                pcVar19 = "comment";
                sStackY_a0 = 7;
LAB_0019a4f6:
                iVar6 = strncmp(pcVar16,pcVar19,sStackY_a0);
                if (iVar6 != 0) goto LAB_0019a500;
              }
              else {
                if (exp->tok_len[uVar7] != 4) goto LAB_0019a500;
                pcVar16 = pcVar15 + exp->tok_pos[uVar7];
                iVar6 = strncmp(pcVar16,"node",4);
                if (iVar6 != 0) {
                  pcVar19 = "text";
                  sStackY_a0 = 4;
                  goto LAB_0019a4f6;
                }
              }
              plVar9[uVar7] = LYXP_TOKEN_NODETYPE;
LAB_0019a582:
              sStackY_a0 = 1;
              token = LYXP_TOKEN_PAR1;
LAB_0019a590:
              bVar3 = false;
              bVar24 = false;
              break;
            case 0x29:
              sStackY_a0 = 1;
              token = LYXP_TOKEN_PAR2;
              break;
            case 0x2c:
              sStackY_a0 = 1;
              token = LYXP_TOKEN_COMMA;
              break;
            case 0x2e:
              if (pcVar16[1] == '.') {
                sStackY_a0 = 2;
                token = LYXP_TOKEN_DDOT;
              }
              else {
                ppuVar11 = __ctype_b_loc();
                if ((*(byte *)((long)*ppuVar11 + (long)pcVar16[1] * 2 + 1) & 8) != 0)
                goto LAB_0019a49a;
                sStackY_a0 = 1;
                token = LYXP_TOKEN_DOT;
              }
              break;
            default:
              if (iVar6 == 0x40) {
                sStackY_a0 = 1;
                token = LYXP_TOKEN_AT;
              }
              else if (iVar6 == 0x5b) {
                sStackY_a0 = 1;
                token = LYXP_TOKEN_BRACK1;
              }
              else {
                if (iVar6 != 0x5d) goto switchD_0019a2c7_caseD_23;
                token = LYXP_TOKEN_BRACK2;
                sStackY_a0 = 1;
              }
            }
            LVar5 = exp_add_token(ctx,exp,token,(uint32_t)lVar21,(uint32_t)sStackY_a0);
            pplVar23 = local_48;
            if (LVar5 != LY_SUCCESS) goto LAB_0019a277;
            for (lVar21 = lVar21 + sStackY_a0; uVar22 = (ulong)(byte)pcVar15[lVar21], uVar22 < 0x21;
                lVar21 = lVar21 + 1) {
              if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                if (uVar22 == 0) {
                  if ((char)local_4c != '\0') {
                    pplVar14 = (lyxp_expr_type **)calloc((ulong)exp->size,8);
                    exp->repeat = pplVar14;
                    if (pplVar14 == (lyxp_expr_type **)0x0) goto LAB_0019a269;
                    LVar8 = reparse_or_expr(ctx,exp,&tok_idx,0);
                    LVar5 = LY_EVALID;
                    if (LVar8 != LY_SUCCESS) goto LAB_0019a277;
                    if (tok_idx < exp->used) {
                      ly_vlog(ctx,(char *)0x0,LYVE_XPATH,
                              "Unparsed characters \"%s\" left at the end of an XPath expression.",
                              exp->expr + exp->tok_pos[tok_idx]);
                      goto LAB_0019a277;
                    }
                  }
                  buf = (char *)0x0;
                  size = 0;
                  local_40 = 0;
                  if (2 < ly_ll) {
                    ly_log_dbg(2,"expression \"%s\":",exp->expr);
                    for (uVar22 = 0; uVar22 < exp->used; uVar22 = uVar22 + 1) {
                      pcVar15 = lyxp_token2str(exp->tokens[uVar22]);
                      print_expr_str(&buf,&size,&local_40,"\ttoken %s, in expression \"%.*s\"",
                                     pcVar15,(ulong)exp->tok_len[uVar22],
                                     exp->expr + exp->tok_pos[uVar22]);
                      if ((exp->repeat != (lyxp_expr_type **)0x0) &&
                         (plVar2 = exp->repeat[uVar22], plVar2 != (lyxp_expr_type *)0x0)) {
                        print_expr_str(&buf,&size,&local_40," (repeat %d",(ulong)*plVar2);
                        for (uVar17 = 1; exp->repeat[uVar22][uVar17] != LYXP_EXPR_NONE;
                            uVar17 = (ulong)((int)uVar17 + 1)) {
                          print_expr_str(&buf,&size,&local_40,", %d");
                        }
                        print_expr_str(&buf,&size,&local_40,")");
                      }
                      ly_log_dbg(2,buf);
                      local_40 = 0;
                    }
                    free(buf);
                    pplVar23 = local_48;
                  }
                  *pplVar23 = exp;
                  return LY_SUCCESS;
                }
                break;
              }
            }
          } while( true );
        }
      }
    }
  }
LAB_0019a269:
  LVar5 = LY_EMEM;
  ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxp_expr_parse");
LAB_0019a277:
  lyxp_expr_free(ctx,exp);
  return LVar5;
}

Assistant:

LY_ERR
lyxp_expr_parse(const struct ly_ctx *ctx, const char *expr_str, size_t expr_len, ly_bool reparse, struct lyxp_expr **expr_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_expr *expr;
    size_t parsed = 0, tok_len;
    enum lyxp_token tok_type;
    ly_bool prev_func_check = 0, prev_ntype_check = 0, has_axis;
    uint32_t tok_idx = 0;
    ssize_t ncname_len;

    assert(expr_p);

    if (!expr_str[0]) {
        LOGVAL(ctx, LY_VCODE_XP_EOF);
        return LY_EVALID;
    }

    if (!expr_len) {
        expr_len = strlen(expr_str);
    }
    if (expr_len > UINT32_MAX) {
        LOGVAL(ctx, LYVE_XPATH, "XPath expression cannot be longer than %" PRIu32 " characters.", UINT32_MAX);
        return LY_EVALID;
    }

    /* init lyxp_expr structure */
    expr = calloc(1, sizeof *expr);
    LY_CHECK_ERR_GOTO(!expr, LOGMEM(ctx); ret = LY_EMEM, error);
    LY_CHECK_GOTO(ret = lydict_insert(ctx, expr_str, expr_len, &expr->expr), error);
    expr->used = 0;
    expr->size = LYXP_EXPR_SIZE_START;
    expr->tokens = malloc(expr->size * sizeof *expr->tokens);
    LY_CHECK_ERR_GOTO(!expr->tokens, LOGMEM(ctx); ret = LY_EMEM, error);

    expr->tok_pos = malloc(expr->size * sizeof *expr->tok_pos);
    LY_CHECK_ERR_GOTO(!expr->tok_pos, LOGMEM(ctx); ret = LY_EMEM, error);

    expr->tok_len = malloc(expr->size * sizeof *expr->tok_len);
    LY_CHECK_ERR_GOTO(!expr->tok_len, LOGMEM(ctx); ret = LY_EMEM, error);

    /* make expr 0-terminated */
    expr_str = expr->expr;

    while (is_xmlws(expr_str[parsed])) {
        ++parsed;
    }

    do {
        if (expr_str[parsed] == '(') {

            /* '(' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR1;

            if (prev_ntype_check && expr->used && (expr->tokens[expr->used - 1] == LYXP_TOKEN_NAMETEST) &&
                    (((expr->tok_len[expr->used - 1] == 4) &&
                    (!strncmp(&expr_str[expr->tok_pos[expr->used - 1]], "node", 4) ||
                    !strncmp(&expr_str[expr->tok_pos[expr->used - 1]], "text", 4))) ||
                    ((expr->tok_len[expr->used - 1] == 7) &&
                    !strncmp(&expr_str[expr->tok_pos[expr->used - 1]], "comment", 7)))) {
                /* it is NodeType after all */
                expr->tokens[expr->used - 1] = LYXP_TOKEN_NODETYPE;

                prev_ntype_check = 0;
                prev_func_check = 0;
            } else if (prev_func_check && expr->used && (expr->tokens[expr->used - 1] == LYXP_TOKEN_NAMETEST)) {
                /* it is FunctionName after all */
                expr->tokens[expr->used - 1] = LYXP_TOKEN_FUNCNAME;

                prev_ntype_check = 0;
                prev_func_check = 0;
            }

        } else if (expr_str[parsed] == ')') {

            /* ')' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR2;

        } else if (expr_str[parsed] == '[') {

            /* '[' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK1;

        } else if (expr_str[parsed] == ']') {

            /* ']' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK2;

        } else if (!strncmp(&expr_str[parsed], "..", 2)) {

            /* '..' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_DDOT;

        } else if ((expr_str[parsed] == '.') && (!isdigit(expr_str[parsed + 1]))) {

            /* '.' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_DOT;

        } else if (expr_str[parsed] == '@') {

            /* '@' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_AT;

        } else if (expr_str[parsed] == ',') {

            /* ',' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_COMMA;

        } else if (expr_str[parsed] == '\'') {

            /* Literal with ' */
            for (tok_len = 1; (expr_str[parsed + tok_len] != '\0') && (expr_str[parsed + tok_len] != '\''); ++tok_len) {}
            LY_CHECK_ERR_GOTO(expr_str[parsed + tok_len] == '\0',
                    LOGVAL(ctx, LY_VCODE_XP_EOE, expr_str[parsed], &expr_str[parsed]); ret = LY_EVALID,
                    error);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if (expr_str[parsed] == '\"') {

            /* Literal with " */
            for (tok_len = 1; (expr_str[parsed + tok_len] != '\0') && (expr_str[parsed + tok_len] != '\"'); ++tok_len) {}
            LY_CHECK_ERR_GOTO(expr_str[parsed + tok_len] == '\0',
                    LOGVAL(ctx, LY_VCODE_XP_EOE, expr_str[parsed], &expr_str[parsed]); ret = LY_EVALID,
                    error);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if ((expr_str[parsed] == '.') || (isdigit(expr_str[parsed]))) {

            /* Number */
            for (tok_len = 0; isdigit(expr_str[parsed + tok_len]); ++tok_len) {}
            if (expr_str[parsed + tok_len] == '.') {
                ++tok_len;
                for ( ; isdigit(expr_str[parsed + tok_len]); ++tok_len) {}
            }
            tok_type = LYXP_TOKEN_NUMBER;

        } else if (expr_str[parsed] == '$') {

            /* VariableReference */
            parsed++;
            ncname_len = parse_ncname(&expr_str[parsed]);
            LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                    (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
            tok_len = ncname_len;
            LY_CHECK_ERR_GOTO(expr_str[parsed + tok_len] == ':',
                    LOGVAL(ctx, LYVE_XPATH, "Variable with prefix is not supported."); ret = LY_EVALID,
                    error);
            tok_type = LYXP_TOKEN_VARREF;

        } else if (expr_str[parsed] == '/') {

            /* Operator '/', '//' */
            if (!strncmp(&expr_str[parsed], "//", 2)) {
                tok_len = 2;
                tok_type = LYXP_TOKEN_OPER_RPATH;
            } else {
                tok_len = 1;
                tok_type = LYXP_TOKEN_OPER_PATH;
            }

        } else if (!strncmp(&expr_str[parsed], "!=", 2)) {

            /* Operator '!=' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_OPER_NEQUAL;

        } else if (!strncmp(&expr_str[parsed], "<=", 2) || !strncmp(&expr_str[parsed], ">=", 2)) {

            /* Operator '<=', '>=' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_OPER_COMP;

        } else if (expr_str[parsed] == '|') {

            /* Operator '|' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_UNI;

        } else if ((expr_str[parsed] == '+') || (expr_str[parsed] == '-')) {

            /* Operator '+', '-' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_MATH;

        } else if (expr_str[parsed] == '=') {

            /* Operator '=' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_EQUAL;

        } else if ((expr_str[parsed] == '<') || (expr_str[parsed] == '>')) {

            /* Operator '<', '>' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_COMP;

        } else if (expr->used && (expr->tokens[expr->used - 1] != LYXP_TOKEN_AT) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_PAR1) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_BRACK1) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_COMMA) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_LOG) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_EQUAL) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_NEQUAL) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_COMP) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_MATH) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_UNI) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_PATH) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_RPATH)) {

            /* Operator '*', 'or', 'and', 'mod', or 'div' */
            if (expr_str[parsed] == '*') {
                tok_len = 1;
                tok_type = LYXP_TOKEN_OPER_MATH;

            } else if (!strncmp(&expr_str[parsed], "or", 2)) {
                tok_len = 2;
                tok_type = LYXP_TOKEN_OPER_LOG;

            } else if (!strncmp(&expr_str[parsed], "and", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPER_LOG;

            } else if (!strncmp(&expr_str[parsed], "mod", 3) || !strncmp(&expr_str[parsed], "div", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPER_MATH;

            } else if (prev_ntype_check || prev_func_check) {
                LOGVAL(ctx, LYVE_XPATH,
                        "Invalid character 0x%x ('%c'), perhaps \"%.*s\" is supposed to be a function call.",
                        expr_str[parsed], expr_str[parsed], (int)expr->tok_len[expr->used - 1],
                        &expr->expr[expr->tok_pos[expr->used - 1]]);
                ret = LY_EVALID;
                goto error;
            } else {
                LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed], (uint32_t)(parsed + 1), expr_str);
                ret = LY_EVALID;
                goto error;
            }
        } else {

            /* (AxisName '::')? ((NCName ':')? '*' | QName) or NodeType/FunctionName */
            if (expr_str[parsed] == '*') {
                ncname_len = 1;
            } else {
                ncname_len = parse_ncname(&expr_str[parsed]);
                LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                        (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
            }
            tok_len = ncname_len;

            has_axis = 0;
            if (!strncmp(&expr_str[parsed + tok_len], "::", 2)) {
                /* axis */
                LY_CHECK_ERR_GOTO(expr_parse_axis(&expr_str[parsed], ncname_len),
                        LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed], (uint32_t)(parsed + 1), expr_str); ret = LY_EVALID,
                        error);
                tok_type = LYXP_TOKEN_AXISNAME;

                LY_CHECK_GOTO(ret = exp_add_token(ctx, expr, tok_type, parsed, tok_len), error);
                parsed += tok_len;

                /* '::' */
                tok_len = 2;
                tok_type = LYXP_TOKEN_DCOLON;

                LY_CHECK_GOTO(ret = exp_add_token(ctx, expr, tok_type, parsed, tok_len), error);
                parsed += tok_len;

                if (expr_str[parsed] == '*') {
                    ncname_len = 1;
                } else {
                    ncname_len = parse_ncname(&expr_str[parsed]);
                    LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                            (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
                }
                tok_len = ncname_len;

                has_axis = 1;
            }

            if (expr_str[parsed + tok_len] == ':') {
                ++tok_len;
                if (expr_str[parsed + tok_len] == '*') {
                    ++tok_len;
                } else {
                    ncname_len = parse_ncname(&expr_str[parsed + tok_len]);
                    LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                            (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
                    tok_len += ncname_len;
                }
                /* remove old flags to prevent ambiguities */
                prev_ntype_check = 0;
                prev_func_check = 0;
                tok_type = LYXP_TOKEN_NAMETEST;
            } else {
                /* if not '*', there is no prefix so it can still be NodeType/FunctionName, we can't finally decide now */
                prev_ntype_check = (expr_str[parsed] == '*') ? 0 : 1;
                prev_func_check = (prev_ntype_check && !has_axis) ? 1 : 0;
                tok_type = LYXP_TOKEN_NAMETEST;
            }
        }

        /* store the token, move on to the next one */
        LY_CHECK_GOTO(ret = exp_add_token(ctx, expr, tok_type, parsed, tok_len), error);
        parsed += tok_len;
        while (is_xmlws(expr_str[parsed])) {
            ++parsed;
        }

    } while (expr_str[parsed]);

    if (reparse) {
        /* prealloc repeat */
        expr->repeat = calloc(expr->size, sizeof *expr->repeat);
        LY_CHECK_ERR_GOTO(!expr->repeat, LOGMEM(ctx); ret = LY_EMEM, error);

        /* fill repeat */
        LY_CHECK_ERR_GOTO(reparse_or_expr(ctx, expr, &tok_idx, 0), ret = LY_EVALID, error);
        if (expr->used > tok_idx) {
            LOGVAL(ctx, LYVE_XPATH, "Unparsed characters \"%s\" left at the end of an XPath expression.",
                    &expr->expr[expr->tok_pos[tok_idx]]);
            ret = LY_EVALID;
            goto error;
        }
    }

    print_expr_struct_debug(expr);
    *expr_p = expr;
    return LY_SUCCESS;

error:
    lyxp_expr_free(ctx, expr);
    return ret;
}